

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O0

lzma_match *
hc_find_func(uint32_t len_limit,uint32_t pos,uint8_t *cur,uint32_t cur_match,uint32_t depth,
            uint32_t *son,uint32_t cyclic_pos,uint32_t cyclic_size,lzma_match *matches,
            uint32_t len_best)

{
  uint uVar1;
  uint8_t *puVar2;
  uint32_t uVar3;
  uint32_t local_54;
  uint local_44;
  uint32_t len;
  uint8_t *pb;
  uint32_t delta;
  uint32_t *son_local;
  uint32_t depth_local;
  uint32_t cur_match_local;
  uint8_t *cur_local;
  uint32_t pos_local;
  uint32_t len_limit_local;
  
  son[cyclic_pos] = cur_match;
  son_local._0_4_ = depth;
  son_local._4_4_ = cur_match;
  do {
    do {
      uVar1 = pos - son_local._4_4_;
      uVar3 = (uint32_t)son_local - 1;
      if (((uint32_t)son_local == 0) || (cyclic_size <= uVar1)) {
        return matches;
      }
      puVar2 = cur + -(ulong)uVar1;
      if (cyclic_pos < uVar1) {
        local_54 = cyclic_size;
      }
      else {
        local_54 = 0;
      }
      son_local._4_4_ = son[(cyclic_pos - uVar1) + local_54];
      son_local._0_4_ = uVar3;
    } while ((puVar2[len_best] != cur[len_best]) || (*puVar2 != *cur));
    local_44 = 0;
    do {
      local_44 = local_44 + 1;
      if (local_44 == len_limit) break;
    } while (puVar2[local_44] == cur[local_44]);
    if (len_best < local_44) {
      matches->len = local_44;
      matches->dist = uVar1 - 1;
      matches = matches + 1;
      len_best = local_44;
      if (local_44 == len_limit) {
        return matches;
      }
    }
  } while( true );
}

Assistant:

static lzma_match *
hc_find_func(
		const uint32_t len_limit,
		const uint32_t pos,
		const uint8_t *const cur,
		uint32_t cur_match,
		uint32_t depth,
		uint32_t *const son,
		const uint32_t cyclic_pos,
		const uint32_t cyclic_size,
		lzma_match *matches,
		uint32_t len_best)
{
	son[cyclic_pos] = cur_match;

	while (true) {
		const uint32_t delta = pos - cur_match;
		const uint8_t *pb;
		if (depth-- == 0 || delta >= cyclic_size)
			return matches;

		pb = cur - delta;
		cur_match = son[cyclic_pos - delta
				+ (delta > cyclic_pos ? cyclic_size : 0)];

		if (pb[len_best] == cur[len_best] && pb[0] == cur[0]) {
			uint32_t len = 0;
			while (++len != len_limit)
				if (pb[len] != cur[len])
					break;

			if (len_best < len) {
				len_best = len;
				matches->len = len;
				matches->dist = delta - 1;
				++matches;

				if (len == len_limit)
					return matches;
			}
		}
	}
}